

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O0

vector_type * __thiscall
nanoNet::NeuralNetworkLayer::predict
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *this,vector_type *inputData)

{
  float fVar1;
  bool bVar2;
  const_reference this_00;
  const_reference pvVar3;
  reference pvVar4;
  reference pfVar5;
  float fVar6;
  float *value;
  iterator __end1;
  iterator __begin1;
  vector_type *__range1;
  size_t j;
  size_t i;
  vector_type *inputData_local;
  NeuralNetworkLayer *this_local;
  vector_type *result;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,&this->m_biases);
  for (j = 0; j < this->m_outputCount; j = j + 1) {
    for (__range1 = (vector_type *)0x0; __range1 < (vector_type *)this->m_inputCount;
        __range1 = (vector_type *)
                   ((long)&(__range1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      this_00 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::operator[](&this->m_weights,j);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(size_type)__range1);
      fVar6 = *pvVar3;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](inputData,(size_type)__range1)
      ;
      fVar1 = *pvVar3;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,j);
      *pvVar4 = fVar6 * fVar1 + *pvVar4;
    }
  }
  __end1 = std::vector<float,_std::allocator<float>_>::begin(__return_storage_ptr__);
  value = (float *)std::vector<float,_std::allocator<float>_>::end(__return_storage_ptr__);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                     *)&value), bVar2) {
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    fVar6 = ActivationFunction::operator()(&this->m_activationFunction,*pfVar5);
    *pfVar5 = fVar6;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetworkLayer::predict(const vector_type& inputData) const
{
    vector_type result(m_biases);

    for (std::size_t i = 0; i < m_outputCount; i++)
        for (std::size_t j = 0; j < m_inputCount; j++)
            result[i] += m_weights[i][j] * inputData[j];

    for (auto& value : result)
        value = m_activationFunction(value);

    return result;
}